

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O1

xmlTextReaderPtr xmlNewTextReader(xmlParserInputBufferPtr input,char *URI)

{
  xmlSAXHandlerPtr pxVar1;
  xmlTextReaderPtr __s;
  xmlBufPtr pxVar2;
  xmlSAXHandler *hdlr;
  size_t sVar3;
  xmlChar *chunk;
  xmlParserCtxtPtr pxVar4;
  int size;
  uint uVar5;
  
  if ((input != (xmlParserInputBufferPtr)0x0) &&
     (__s = (xmlTextReaderPtr)(*xmlMalloc)(0x160), __s != (xmlTextReaderPtr)0x0)) {
    memset(__s,0,0x160);
    __s->input = input;
    pxVar2 = xmlBufCreate(0x32);
    __s->buffer = pxVar2;
    if (pxVar2 != (xmlBufPtr)0x0) {
      hdlr = (xmlSAXHandler *)(*xmlMalloc)(0x100);
      __s->sax = hdlr;
      if (hdlr != (xmlSAXHandler *)0x0) {
        xmlSAXVersion(hdlr,2);
        pxVar1 = __s->sax;
        __s->startElement = pxVar1->startElement;
        pxVar1->startElement = xmlTextReaderStartElement;
        __s->endElement = pxVar1->endElement;
        pxVar1->endElement = xmlTextReaderEndElement;
        if (pxVar1->initialized == 0xdeedbeaf) {
          __s->startElementNs = pxVar1->startElementNs;
          pxVar1->startElementNs = xmlTextReaderStartElementNs;
          __s->endElementNs = pxVar1->endElementNs;
          pxVar1->endElementNs = xmlTextReaderEndElementNs;
        }
        else {
          __s->startElementNs = (startElementNsSAX2Func)0x0;
          __s->endElementNs = (endElementNsSAX2Func)0x0;
        }
        __s->characters = pxVar1->characters;
        pxVar1->characters = xmlTextReaderCharacters;
        pxVar1->ignorableWhitespace = xmlTextReaderCharacters;
        __s->cdataBlock = pxVar1->cdataBlock;
        pxVar1->cdataBlock = xmlTextReaderCDataBlock;
        __s->mode = 0;
        __s->node = (xmlNodePtr)0x0;
        __s->curnode = (xmlNodePtr)0x0;
        sVar3 = xmlBufUse(__s->input->buffer);
        if (sVar3 < 4) {
          xmlParserInputBufferRead(input,4);
        }
        sVar3 = xmlBufUse(__s->input->buffer);
        pxVar1 = __s->sax;
        if (sVar3 < 4) {
          uVar5 = 0;
          chunk = (xmlChar *)0x0;
          size = 0;
        }
        else {
          chunk = xmlBufContent(__s->input->buffer);
          uVar5 = 4;
          size = 4;
        }
        pxVar4 = xmlCreatePushParserCtxt(pxVar1,(void *)0x0,(char *)chunk,size,URI);
        __s->ctxt = pxVar4;
        __s->base = 0;
        __s->cur = uVar5;
        if (pxVar4 == (xmlParserCtxtPtr)0x0) {
          xmlBufFree(__s->buffer);
          (*xmlFree)(__s->sax);
          (*xmlFree)(__s);
          return (xmlTextReaderPtr)0x0;
        }
        pxVar4->parseMode = XML_PARSE_READER;
        pxVar4->_private = __s;
        pxVar4->linenumbers = 1;
        pxVar4->dictNames = 1;
        __s->allocs = 2;
        __s->dict = pxVar4->dict;
        __s->xinclude = 0;
        __s->patternMax = 0;
        __s->patternTab = (xmlPatternPtr *)0x0;
        return __s;
      }
      xmlBufFree(__s->buffer);
    }
    (*xmlFree)(__s);
  }
  return (xmlTextReaderPtr)0x0;
}

Assistant:

xmlTextReaderPtr
xmlNewTextReader(xmlParserInputBufferPtr input, const char *URI) {
    xmlTextReaderPtr ret;

    if (input == NULL)
	return(NULL);
    ret = xmlMalloc(sizeof(xmlTextReader));
    if (ret == NULL)
	return(NULL);
    memset(ret, 0, sizeof(xmlTextReader));
    ret->doc = NULL;
    ret->entTab = NULL;
    ret->entMax = 0;
    ret->entNr = 0;
    ret->input = input;
    ret->buffer = xmlBufCreate(50);
    if (ret->buffer == NULL) {
        xmlFree(ret);
	return(NULL);
    }
    ret->sax = (xmlSAXHandler *) xmlMalloc(sizeof(xmlSAXHandler));
    if (ret->sax == NULL) {
	xmlBufFree(ret->buffer);
	xmlFree(ret);
	return(NULL);
    }
    xmlSAXVersion(ret->sax, 2);
    ret->startElement = ret->sax->startElement;
    ret->sax->startElement = xmlTextReaderStartElement;
    ret->endElement = ret->sax->endElement;
    ret->sax->endElement = xmlTextReaderEndElement;
#ifdef LIBXML_SAX1_ENABLED
    if (ret->sax->initialized == XML_SAX2_MAGIC) {
#endif /* LIBXML_SAX1_ENABLED */
	ret->startElementNs = ret->sax->startElementNs;
	ret->sax->startElementNs = xmlTextReaderStartElementNs;
	ret->endElementNs = ret->sax->endElementNs;
	ret->sax->endElementNs = xmlTextReaderEndElementNs;
#ifdef LIBXML_SAX1_ENABLED
    } else {
	ret->startElementNs = NULL;
	ret->endElementNs = NULL;
    }
#endif /* LIBXML_SAX1_ENABLED */
    ret->characters = ret->sax->characters;
    ret->sax->characters = xmlTextReaderCharacters;
    ret->sax->ignorableWhitespace = xmlTextReaderCharacters;
    ret->cdataBlock = ret->sax->cdataBlock;
    ret->sax->cdataBlock = xmlTextReaderCDataBlock;

    ret->mode = XML_TEXTREADER_MODE_INITIAL;
    ret->node = NULL;
    ret->curnode = NULL;
    if (xmlBufUse(ret->input->buffer) < 4) {
	xmlParserInputBufferRead(input, 4);
    }
    if (xmlBufUse(ret->input->buffer) >= 4) {
	ret->ctxt = xmlCreatePushParserCtxt(ret->sax, NULL,
			     (const char *) xmlBufContent(ret->input->buffer),
                                            4, URI);
	ret->base = 0;
	ret->cur = 4;
    } else {
	ret->ctxt = xmlCreatePushParserCtxt(ret->sax, NULL, NULL, 0, URI);
	ret->base = 0;
	ret->cur = 0;
    }

    if (ret->ctxt == NULL) {
	xmlBufFree(ret->buffer);
	xmlFree(ret->sax);
	xmlFree(ret);
	return(NULL);
    }
    ret->ctxt->parseMode = XML_PARSE_READER;
    ret->ctxt->_private = ret;
    ret->ctxt->linenumbers = 1;
    ret->ctxt->dictNames = 1;
    ret->allocs = XML_TEXTREADER_CTXT;
    /*
     * use the parser dictionary to allocate all elements and attributes names
     */
    ret->dict = ret->ctxt->dict;
#ifdef LIBXML_XINCLUDE_ENABLED
    ret->xinclude = 0;
#endif
#ifdef LIBXML_PATTERN_ENABLED
    ret->patternMax = 0;
    ret->patternTab = NULL;
#endif
    return(ret);
}